

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# automaton.c
# Opt level: O1

ssize_t MAFSA_automaton_find(MAFSA_automaton ma,MAFSA_letter *l,size_t sz_l)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  bool bVar8;
  
  uVar1 = *ma->ptr_nodes;
  uVar4 = 0;
  if (sz_l == 0) {
    bVar8 = true;
    uVar6 = 0;
  }
  else {
    uVar6 = 0;
    do {
      uVar7 = uVar1 & 0x7fffffff;
      uVar3 = ma->ptr_links[uVar7];
      uVar5 = 0;
      if (uVar3 != 0xff000000) {
        do {
          uVar7 = uVar7 + 1;
          if (l[uVar6] == (MAFSA_letter)(uVar3 >> 0x18)) {
            uVar5 = uVar3 & 0xffffff;
            break;
          }
          uVar3 = ma->ptr_links[uVar7];
          uVar5 = 0;
        } while (uVar3 != 0xff000000);
      }
      bVar8 = uVar5 == 0;
      if (!bVar8) {
        uVar1 = ma->ptr_nodes[uVar5];
      }
      uVar4 = uVar4 + 1;
      uVar6 = (ulong)uVar4;
    } while ((uVar5 != 0) && (uVar6 < sz_l));
  }
  uVar2 = (ulong)(uVar1 >> 0x1f);
  if (bVar8) {
    uVar2 = 0;
  }
  if (uVar6 < sz_l) {
    uVar2 = 0;
  }
  return uVar2;
}

Assistant:

extern ssize_t MAFSA_automaton_find(MAFSA_automaton ma, const MAFSA_letter *l, size_t sz_l)
{
    uint32_t i = 0;
    uint32_t current = ma->ptr_nodes[0];
    uint32_t where = 0;

    while (i < sz_l)
    {
        MAFSA_letter label = l[i++];

        where = MAFSA_delta(ma->ptr_links, current, label);

        if (where)
        {
            current = ma->ptr_nodes[where];
        }
        else
        {
            break;
        }
    }

    if (i < sz_l) return 0;
    if (!where) return 0;
    if (!node_is_final(current)) return 0;

    return 1;
}